

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall Liby::TimerQueue::updateTimerfd(TimerQueue *this,Timestamp *timeout)

{
  int iVar1;
  suseconds_t sVar2;
  Logger *this_00;
  int *piVar3;
  double __x;
  int ret;
  undefined1 local_38 [8];
  itimerspec new_timer;
  Timestamp *timeout_local;
  TimerQueue *this_local;
  
  new_timer.it_value.tv_nsec = (__syscall_slong_t)timeout;
  new_timer.it_interval.tv_nsec = Timestamp::sec(timeout);
  sVar2 = Timestamp::usec((Timestamp *)new_timer.it_value.tv_nsec);
  new_timer.it_value.tv_sec = sVar2 * 1000;
  local_38 = (undefined1  [8])0x0;
  new_timer.it_interval.tv_sec = 0;
  iVar1 = timerfd_settime(this->timerfd_,1,(itimerspec *)local_38,(itimerspec *)0x0);
  if (iVar1 < 0) {
    this_00 = Logger::getLogger();
    piVar3 = __errno_location();
    strerror(*piVar3);
    Logger::log(this_00,__x);
  }
  return;
}

Assistant:

void TimerQueue::updateTimerfd(const Timestamp &timeout) {
#ifdef __linux
    struct itimerspec new_timer;
    new_timer.it_value.tv_sec = timeout.sec();
    new_timer.it_value.tv_nsec = timeout.usec() * 1000;
    new_timer.it_interval = {0, 0};
    int ret = ::timerfd_settime(timerfd_, TFD_TIMER_ABSTIME, &new_timer, NULL);
    errorif(ret < 0, "timer_settime: %s", ::strerror(errno));
#else
    ClearUnuseVariableWarning(timeout);
#endif
}